

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm_cpu_realizefn_arm(uc_struct_conflict1 *uc,CPUState *dev)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  CPUARMState *env_00;
  TranslationBlock *pTVar5;
  uint smp_cpus;
  uint32_t nr_1;
  uint32_t nr;
  anon_struct_4_1_54a39816 v_36;
  anon_struct_4_1_54a39816 v_35;
  anon_struct_4_1_54a39816 v_34;
  anon_struct_4_1_54a39816 v_33;
  anon_struct_4_1_54a39816 v_32;
  anon_struct_4_1_54a39816 v_31;
  anon_struct_4_1_54a39816 v_30;
  uint32_t u_3;
  anon_struct_4_1_54a39816 v_29;
  anon_struct_4_1_54a39816 v_28;
  anon_struct_4_1_54a39816 v_27;
  anon_struct_4_1_54a39816 v_26;
  uint32_t u_2;
  uint64_t t_2;
  anon_struct_4_1_54a39816 v_25;
  anon_struct_4_1_54a39816 v_24;
  anon_struct_4_1_54a39816 v_23;
  anon_struct_4_1_54a39816 v_22;
  anon_struct_4_1_54a39816 v_21;
  anon_struct_4_1_54a39816 v_20;
  anon_struct_4_1_54a39816 v_19;
  anon_struct_4_1_54a39816 v_18;
  anon_struct_4_1_54a39816 v_17;
  anon_struct_4_1_54a39816 v_16;
  anon_struct_4_1_54a39816 v_15;
  anon_struct_4_1_54a39816 v_14;
  uint32_t u_1;
  uint64_t t_1;
  anon_struct_4_1_54a39816 v_13;
  anon_struct_4_1_54a39816 v_12;
  anon_struct_4_1_54a39816 v_11;
  anon_struct_4_1_54a39816 v_10;
  anon_struct_4_1_54a39816 v_9;
  anon_struct_4_1_54a39816 v_8;
  anon_struct_4_1_54a39816 v_7;
  anon_struct_4_1_54a39816 v_6;
  anon_struct_4_1_54a39816 v_5;
  anon_struct_4_1_54a39816 v_4;
  anon_struct_4_1_54a39816 v_3;
  anon_struct_4_1_54a39816 v_2;
  anon_struct_4_1_54a39816 v_1;
  anon_struct_4_1_54a39816 v;
  uint32_t u;
  uint64_t t;
  _Bool no_aa32;
  CPUARMState *env;
  ARMCPU *cpu;
  CPUState *cs;
  CPUState *dev_local;
  uc_struct_conflict1 *uc_local;
  
  env_00 = (CPUARMState *)(dev[1].tb_jmp_cache + 0x3ff);
  t._7_1_ = 0;
  cpu_exec_realizefn_arm(dev);
  arm_cpu_finalize_features((ARMCPU *)dev);
  iVar3 = arm_feature(env_00,0x1c);
  if ((iVar3 == 0) ||
     ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317f) & 1) ==
      (*(byte *)(dev[1].tb_jmp_cache + 0x630) & 1))) {
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317f) & 1) == 0) {
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63e],0xc,4,0);
      dev[1].tb_jmp_cache[0x63e] = pTVar5;
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63f],0x10,4,0xf);
      dev[1].tb_jmp_cache[0x63f] = pTVar5;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x637),0,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x637) = uVar4;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x63a),4,4,0);
      uVar4 = deposit32(uVar4,8,4,0);
      uVar4 = deposit32(uVar4,0xc,4,0);
      uVar4 = deposit32(uVar4,0x10,4,0);
      uVar4 = deposit32(uVar4,0x14,4,0);
      uVar4 = deposit32(uVar4,0x18,4,0);
      uVar4 = deposit32(uVar4,0x1c,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x63a) = uVar4;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4),0,4,0);
      uVar4 = deposit32(uVar4,4,4,0);
      uVar4 = deposit32(uVar4,0x18,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4) = uVar4;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x63b),4,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x63b) = uVar4;
    }
    if (((ulong)dev[1].tb_jmp_cache[0x630] & 1) == 0) {
      unset_feature(env_00,8);
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63d],0x2c,4,0);
      dev[1].tb_jmp_cache[0x63d] = pTVar5;
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63e],0x10,4,0);
      dev[1].tb_jmp_cache[0x63e] = pTVar5;
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63f],0x14,4,0xf);
      dev[1].tb_jmp_cache[0x63f] = pTVar5;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31b4),0x18,4,0);
      uVar4 = deposit32(uVar4,0x1c,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31b4) = uVar4;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x637),4,4,0);
      uVar4 = deposit32(uVar4,8,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x637) = uVar4;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4),8,4,0);
      uVar4 = deposit32(uVar4,0xc,4,0);
      uVar4 = deposit32(uVar4,0x10,4,0);
      uVar4 = deposit32(uVar4,0x14,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4) = uVar4;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x63b),0,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x63b) = uVar4;
    }
    if ((((ulong)dev[1].tb_jmp_cache[0x630] & 1) == 0) &&
       ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317f) & 1) == 0)) {
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63d],0x30,4,0);
      dev[1].tb_jmp_cache[0x63d] = pTVar5;
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x63e],0x20,4,0);
      dev[1].tb_jmp_cache[0x63e] = pTVar5;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x63a),0,4,0);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x63a) = uVar4;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4),0x1c,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31d4) = uVar4;
    }
    iVar3 = arm_feature(env_00,9);
    if ((iVar3 != 0) && ((*(byte *)((long)dev[1].tb_jmp_cache + 0x3181) & 1) == 0)) {
      unset_feature(env_00,0x22);
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31a4),0xc,4,1);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31a4) = uVar4;
      uVar4 = deposit32(*(uint32_t *)(dev[1].tb_jmp_cache + 0x635),0x14,4,1);
      uVar4 = deposit32(uVar4,0x10,4,1);
      *(uint32_t *)(dev[1].tb_jmp_cache + 0x635) = uVar4;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31ac),4,4,1);
      uVar4 = deposit32(uVar4,0,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31ac) = uVar4;
    }
    iVar3 = arm_feature(env_00,0x1b);
    if (iVar3 != 0) {
      iVar3 = arm_feature(env_00,9);
      if (iVar3 == 0) {
        set_feature(env_00,0xd);
      }
      else {
        set_feature(env_00,5);
      }
    }
    iVar3 = arm_feature((CPUARMState *)(dev[1].tb_jmp_cache + 0x3ff),0x1c);
    if (iVar3 != 0) {
      _Var2 = isar_feature_aa64_aa32((ARMISARegisters *)(dev[1].tb_jmp_cache + 0x634));
      t._7_1_ = (_Var2 ^ 0xffU) & 1;
    }
    iVar3 = arm_feature(env_00,0xd);
    if (iVar3 != 0) {
      if ((t._7_1_ == 0) &&
         (_Var2 = isar_feature_aa32_arm_div((ARMISARegisters *)(dev[1].tb_jmp_cache + 0x634)),
         !_Var2)) {
        __assert_fail("no_aa32 || cpu_isar_feature(aa32_arm_div, cpu)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                      ,0x3bb,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
      }
      set_feature(env_00,0x1a);
      set_feature(env_00,5);
    }
    iVar3 = arm_feature(env_00,5);
    if (iVar3 != 0) {
      set_feature(env_00,0x11);
      set_feature(env_00,6);
      set_feature(env_00,0x18);
      iVar3 = arm_feature(env_00,9);
      if (iVar3 == 0) {
        set_feature(env_00,4);
      }
      else {
        set_feature(env_00,3);
      }
      set_feature(env_00,0x24);
    }
    iVar3 = arm_feature(env_00,4);
    if (iVar3 != 0) {
      set_feature(env_00,3);
      set_feature(env_00,0x13);
    }
    iVar3 = arm_feature(env_00,3);
    if (iVar3 != 0) {
      set_feature(env_00,0xf);
      iVar3 = arm_feature(env_00,9);
      if (iVar3 == 0) {
        if ((t._7_1_ == 0) &&
           (_Var2 = isar_feature_aa32_jazelle((ARMISARegisters *)(dev[1].tb_jmp_cache + 0x634)),
           !_Var2)) {
          __assert_fail("no_aa32 || cpu_isar_feature(aa32_jazelle, cpu)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                        ,0x3d7,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
        }
        set_feature(env_00,0);
      }
    }
    iVar3 = arm_feature(env_00,0xf);
    if (iVar3 != 0) {
      set_feature(env_00,0xe);
    }
    iVar3 = arm_feature(env_00,0x1a);
    if (iVar3 != 0) {
      set_feature(env_00,0xc);
      set_feature(env_00,0x19);
    }
    iVar3 = arm_feature(env_00,0x1f);
    if (iVar3 != 0) {
      set_feature(env_00,0x1d);
    }
    iVar3 = arm_feature(env_00,6);
    if ((iVar3 != 0) && (iVar3 = arm_feature(env_00,9), iVar3 == 0)) {
      set_feature(env_00,0x22);
    }
    iVar3 = arm_feature((CPUARMState *)(dev[1].tb_jmp_cache + 0x3ff),0x1c);
    if (((iVar3 == 0) &&
        (_Var2 = isar_feature_aa32_vfp_simd((ARMISARegisters *)(dev[1].tb_jmp_cache + 0x634)), _Var2
        )) && (iVar3 = arm_feature(env_00,1), iVar3 != 0)) {
      __assert_fail("arm_feature(&cpu->env, ARM_FEATURE_AARCH64) || !cpu_isar_feature(aa32_vfp_simd, cpu) || !arm_feature(env, ARM_FEATURE_XSCALE)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                    ,0x3f1,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
    }
    if (dev[1].tb_jmp_cache[0x650] == (TranslationBlock *)0xffffff00ff000000) {
      pTVar5 = (TranslationBlock *)arm_cpu_mp_affinity(dev->cpu_index,'\b');
      dev[1].tb_jmp_cache[0x650] = pTVar5;
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x3314) & 1) != 0) {
      *(uint *)(dev[1].tb_jmp_cache + 0x648) = *(uint *)(dev[1].tb_jmp_cache + 0x648) | 0x2000;
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x3334) & 1) != 0) {
      iVar3 = arm_feature((CPUARMState *)(dev[1].tb_jmp_cache + 0x3ff),5);
      if (iVar3 == 0) {
        *(uint *)(dev[1].tb_jmp_cache + 0x648) = *(uint *)(dev[1].tb_jmp_cache + 0x648) | 0x80;
      }
      else {
        *(uint *)(dev[1].tb_jmp_cache + 0x648) = *(uint *)(dev[1].tb_jmp_cache + 0x648) | 0x2000000;
      }
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317d) & 1) == 0) {
      unset_feature(env_00,0x21);
      *(uint *)(dev[1].tb_jmp_cache + 0x649) = *(uint *)(dev[1].tb_jmp_cache + 0x649) & 0xffffff0f;
      dev[1].tb_jmp_cache[0x63f] =
           (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x63f] & 0xffffffffffff0fff);
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317c) & 1) == 0) {
      unset_feature(env_00,0x20);
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x317e) & 1) == 0) {
      unset_feature(env_00,0x23);
    }
    iVar3 = arm_feature(env_00,0x23);
    if (iVar3 == 0) {
      pTVar5 = (TranslationBlock *)deposit64((uint64_t)dev[1].tb_jmp_cache[0x644],8,4,0);
      dev[1].tb_jmp_cache[0x644] = pTVar5;
      uVar4 = deposit32(*(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31dc),0x18,4,0);
      *(uint32_t *)((long)dev[1].tb_jmp_cache + 0x31dc) = uVar4;
      dev[1].tb_jmp_cache[0x64a] = (TranslationBlock *)0x0;
      dev[1].tb_jmp_cache[0x64b] = (TranslationBlock *)0x0;
    }
    else {
      pmu_init_arm((ARMCPU *)dev);
      arm_register_pre_el_change_hook((ARMCPU *)dev,pmu_pre_el_change_arm,(void *)0x0);
      arm_register_el_change_hook((ARMCPU *)dev,pmu_post_el_change_arm,(void *)0x0);
    }
    iVar3 = arm_feature(env_00,0x20);
    if (iVar3 == 0) {
      dev[1].tb_jmp_cache[0x63f] =
           (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x63f] & 0xfffffffffffff0ff);
      *(uint *)(dev[1].tb_jmp_cache + 0x649) = *(uint *)(dev[1].tb_jmp_cache + 0x649) & 0xffff0fff;
    }
    if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x3182) & 1) == 0) {
      *(undefined4 *)((long)dev[1].tb_jmp_cache + 0x3184) = 0;
    }
    if (*(int *)((long)dev[1].tb_jmp_cache + 0x3184) == 0) {
      *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x3182) = 0;
    }
    iVar3 = arm_feature(env_00,7);
    if ((iVar3 != 0) && (iVar3 = arm_feature(env_00,5), iVar3 != 0)) {
      uVar1 = *(uint *)((long)dev[1].tb_jmp_cache + 0x3184);
      if (0xff < uVar1) {
        return;
      }
      if (uVar1 != 0) {
        iVar3 = arm_feature(env_00,0x1b);
        if (iVar3 == 0) {
          pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
          dev[1].tb_jmp_cache[0x5f4] = pTVar5;
          pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
          dev[1].tb_jmp_cache[0x5f5] = pTVar5;
          pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
          dev[1].tb_jmp_cache[0x5f6] = pTVar5;
        }
        else {
          pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
          dev[1].tb_jmp_cache[0x5f8] = pTVar5;
          pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
          dev[1].tb_jmp_cache[0x5fa] = pTVar5;
          iVar3 = arm_feature(env_00,0x25);
          if (iVar3 != 0) {
            pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
            dev[1].tb_jmp_cache[0x5f9] = pTVar5;
            pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
            dev[1].tb_jmp_cache[0x5fb] = pTVar5;
          }
        }
      }
    }
    iVar3 = arm_feature(env_00,0x25);
    if (iVar3 != 0) {
      uVar1 = *(uint *)(dev[1].tb_jmp_cache + 0x631);
      if (0xff < uVar1) {
        return;
      }
      if (uVar1 != 0) {
        pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
        dev[1].tb_jmp_cache[0x5fe] = pTVar5;
        pTVar5 = (TranslationBlock *)g_malloc0_n((ulong)uVar1,4);
        dev[1].tb_jmp_cache[0x5ff] = pTVar5;
      }
    }
    iVar3 = arm_feature(env_00,0x21);
    if (iVar3 != 0) {
      set_feature(env_00,0x24);
    }
    register_cp_regs_for_features_arm((ARMCPU *)dev);
    if (((*(byte *)((long)dev[1].tb_jmp_cache + 0x317d) & 1) == 0) &&
       (iVar3 = arm_feature(env_00,0x25), iVar3 == 0)) {
      dev->num_ases = 1;
    }
    else {
      dev->num_ases = 2;
      if (dev[1].tb_jmp_cache[0x62c] == (TranslationBlock *)0x0) {
        dev[1].tb_jmp_cache[0x62c] = (TranslationBlock *)dev->memory;
      }
      cpu_address_space_init_arm(dev,1,(MemoryRegion *)dev[1].tb_jmp_cache[0x62c]);
    }
    cpu_address_space_init_arm(dev,0,dev->memory);
    if (*(int *)(dev[1].tb_jmp_cache + 0x633) == -1) {
      *(undefined4 *)(dev[1].tb_jmp_cache + 0x633) = 1;
    }
    cpu_reset(dev);
  }
  return;
}

Assistant:

void arm_cpu_realizefn(struct uc_struct *uc, CPUState *dev)
{
    CPUState *cs = CPU(dev);
    ARMCPU *cpu = ARM_CPU(dev);
    CPUARMState *env = &cpu->env;
#ifndef NDEBUG
    bool no_aa32 = false;
#endif

#if 0
    /* The NVIC and M-profile CPU are two halves of a single piece of
     * hardware; trying to use one without the other is a command line
     * error and will result in segfaults if not caught here.
     */
    if (arm_feature(env, ARM_FEATURE_M)) {
        if (!env->nvic) {
            return;
        }
    } else {
        if (env->nvic) {
            return;
        }
    }

    if (arm_feature(env, ARM_FEATURE_GENERIC_TIMER)) {
        if (!cpu->gt_cntfrq_hz) {
            return;
        }
    }
#endif

    cpu_exec_realizefn(cs);

    arm_cpu_finalize_features(cpu);

    if (arm_feature(env, ARM_FEATURE_AARCH64) &&
        cpu->has_vfp != cpu->has_neon) {
        /*
         * This is an architectural requirement for AArch64; AArch32 is
         * more flexible and permits VFP-no-Neon and Neon-no-VFP.
         */
        // error_setg(errp, "AArch64 CPUs must have both VFP and Neon or neither");
        return;
    }

    if (!cpu->has_vfp) {
        uint64_t t;
        uint32_t u;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, JSCVT, 0, t);
        cpu->isar.id_aa64isar1 = t;

        t = cpu->isar.id_aa64pfr0;
        FIELD_DP64(t, ID_AA64PFR0, FP, 0xf, t);
        cpu->isar.id_aa64pfr0 = t;

        u = cpu->isar.id_isar6;
        FIELD_DP32(u, ID_ISAR6, JSCVT, 0, u);
        cpu->isar.id_isar6 = u;

        u = cpu->isar.mvfr0;
        FIELD_DP32(u, MVFR0, FPSP, 0, u);
        FIELD_DP32(u, MVFR0, FPDP, 0, u);
        FIELD_DP32(u, MVFR0, FPTRAP, 0, u);
        FIELD_DP32(u, MVFR0, FPDIVIDE, 0, u);
        FIELD_DP32(u, MVFR0, FPSQRT, 0, u);
        FIELD_DP32(u, MVFR0, FPSHVEC, 0, u);
        FIELD_DP32(u, MVFR0, FPROUND, 0, u);
        cpu->isar.mvfr0 = u;

        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, FPFTZ, 0, u);
        FIELD_DP32(u, MVFR1, FPDNAN, 0, u);
        FIELD_DP32(u, MVFR1, FPHP, 0, u);
        cpu->isar.mvfr1 = u;

        u = cpu->isar.mvfr2;
        FIELD_DP32(u, MVFR2, FPMISC, 0, u);
        cpu->isar.mvfr2 = u;
    }

    if (!cpu->has_neon) {
        uint64_t t;
        uint32_t u;

        unset_feature(env, ARM_FEATURE_NEON);

        t = cpu->isar.id_aa64isar0;
        FIELD_DP64(t, ID_AA64ISAR0, DP, 0, t);
        cpu->isar.id_aa64isar0 = t;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, FCMA, 0, t);
        cpu->isar.id_aa64isar1 = t;

        t = cpu->isar.id_aa64pfr0;
        FIELD_DP64(t, ID_AA64PFR0, ADVSIMD, 0xf, t);
        cpu->isar.id_aa64pfr0 = t;

        u = cpu->isar.id_isar5;
        FIELD_DP32(u, ID_ISAR5, RDM, 0, u);
        FIELD_DP32(u, ID_ISAR5, VCMA, 0, u);
        cpu->isar.id_isar5 = u;

        u = cpu->isar.id_isar6;
        FIELD_DP32(u, ID_ISAR6, DP, 0, u);
        FIELD_DP32(u, ID_ISAR6, FHM, 0, u);
        cpu->isar.id_isar6 = u;

        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, SIMDLS, 0, u);
        FIELD_DP32(u, MVFR1, SIMDINT, 0, u);
        FIELD_DP32(u, MVFR1, SIMDSP, 0, u);
        FIELD_DP32(u, MVFR1, SIMDHP, 0, u);
        cpu->isar.mvfr1 = u;

        u = cpu->isar.mvfr2;
        FIELD_DP32(u, MVFR2, SIMDMISC, 0, u);
        cpu->isar.mvfr2 = u;
    }

    if (!cpu->has_neon && !cpu->has_vfp) {
        uint64_t t;
        uint32_t u;

        t = cpu->isar.id_aa64isar0;
        FIELD_DP64(t, ID_AA64ISAR0, FHM, 0, t);
        cpu->isar.id_aa64isar0 = t;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, FRINTTS, 0, t);
        cpu->isar.id_aa64isar1 = t;

        u = cpu->isar.mvfr0;
        FIELD_DP32(u, MVFR0, SIMDREG, 0, u);
        cpu->isar.mvfr0 = u;

        /* Despite the name, this field covers both VFP and Neon */
        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, SIMDFMAC, 0, u);
        cpu->isar.mvfr1 = u;
    }

    if (arm_feature(env, ARM_FEATURE_M) && !cpu->has_dsp) {
        uint32_t u;

        unset_feature(env, ARM_FEATURE_THUMB_DSP);

        u = cpu->isar.id_isar1;
        FIELD_DP32(u, ID_ISAR1, EXTEND, 1, u);
        cpu->isar.id_isar1 = u;

        u = cpu->isar.id_isar2;
        FIELD_DP32(u, ID_ISAR2, MULTU, 1, u);
        FIELD_DP32(u, ID_ISAR2, MULTS, 1, u);
        cpu->isar.id_isar2 = u;

        u = cpu->isar.id_isar3;
        FIELD_DP32(u, ID_ISAR3, SIMD, 1, u);
        FIELD_DP32(u, ID_ISAR3, SATURATE, 0, u);
        cpu->isar.id_isar3 = u;
    }

    /* Some features automatically imply others: */
    if (arm_feature(env, ARM_FEATURE_V8)) {
        if (arm_feature(env, ARM_FEATURE_M)) {
            set_feature(env, ARM_FEATURE_V7);
        } else {
            set_feature(env, ARM_FEATURE_V7VE);
        }
    }

    /*
     * There exist AArch64 cpus without AArch32 support.  When KVM
     * queries ID_ISAR0_EL1 on such a host, the value is UNKNOWN.
     * Similarly, we cannot check ID_AA64PFR0 without AArch64 support.
     * As a general principle, we also do not make ID register
     * consistency checks anywhere unless using TCG, because only
     * for TCG would a consistency-check failure be a QEMU bug.
     */
    if (arm_feature(&cpu->env, ARM_FEATURE_AARCH64)) {
#ifndef NDEBUG
        no_aa32 = !cpu_isar_feature(aa64_aa32, cpu);
#else
        cpu_isar_feature(aa64_aa32, cpu);
#endif
    }

    if (arm_feature(env, ARM_FEATURE_V7VE)) {
        /* v7 Virtualization Extensions. In real hardware this implies
         * EL2 and also the presence of the Security Extensions.
         * For QEMU, for backwards-compatibility we implement some
         * CPUs or CPU configs which have no actual EL2 or EL3 but do
         * include the various other features that V7VE implies.
         * Presence of EL2 itself is ARM_FEATURE_EL2, and of the
         * Security Extensions is ARM_FEATURE_EL3.
         */
#ifndef NDEBUG
        assert(no_aa32 || cpu_isar_feature(aa32_arm_div, cpu));
#endif
        set_feature(env, ARM_FEATURE_LPAE);
        set_feature(env, ARM_FEATURE_V7);
    }
    if (arm_feature(env, ARM_FEATURE_V7)) {
        set_feature(env, ARM_FEATURE_VAPA);
        set_feature(env, ARM_FEATURE_THUMB2);
        set_feature(env, ARM_FEATURE_MPIDR);
        if (!arm_feature(env, ARM_FEATURE_M)) {
            set_feature(env, ARM_FEATURE_V6K);
        } else {
            set_feature(env, ARM_FEATURE_V6);
        }

        /* Always define VBAR for V7 CPUs even if it doesn't exist in
         * non-EL3 configs. This is needed by some legacy boards.
         */
        set_feature(env, ARM_FEATURE_VBAR);
    }
    if (arm_feature(env, ARM_FEATURE_V6K)) {
        set_feature(env, ARM_FEATURE_V6);
        set_feature(env, ARM_FEATURE_MVFR);
    }
    if (arm_feature(env, ARM_FEATURE_V6)) {
        set_feature(env, ARM_FEATURE_V5);
        if (!arm_feature(env, ARM_FEATURE_M)) {
#ifndef NDEBUG
            assert(no_aa32 || cpu_isar_feature(aa32_jazelle, cpu));
#endif
            set_feature(env, ARM_FEATURE_AUXCR);
        }
    }
    if (arm_feature(env, ARM_FEATURE_V5)) {
        set_feature(env, ARM_FEATURE_V4T);
    }
    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        set_feature(env, ARM_FEATURE_V7MP);
        set_feature(env, ARM_FEATURE_PXN);
    }
    if (arm_feature(env, ARM_FEATURE_CBAR_RO)) {
        set_feature(env, ARM_FEATURE_CBAR);
    }
    if (arm_feature(env, ARM_FEATURE_THUMB2) &&
        !arm_feature(env, ARM_FEATURE_M)) {
        set_feature(env, ARM_FEATURE_THUMB_DSP);
    }

    /*
     * We rely on no XScale CPU having VFP so we can use the same bits in the
     * TB flags field for VECSTRIDE and XSCALE_CPAR.
     */
    assert(arm_feature(&cpu->env, ARM_FEATURE_AARCH64) ||
           !cpu_isar_feature(aa32_vfp_simd, cpu) ||
           !arm_feature(env, ARM_FEATURE_XSCALE));

#if 0
    if (arm_feature(env, ARM_FEATURE_V7) &&
        !arm_feature(env, ARM_FEATURE_M) &&
        !arm_feature(env, ARM_FEATURE_PMSA)) {
        /* v7VMSA drops support for the old ARMv5 tiny pages, so we
         * can use 4K pages.
         */
        pagebits = 12;
    } else {
        /* For CPUs which might have tiny 1K pages, or which have an
         * MPU and might have small region sizes, stick with 1K pages.
         */
        pagebits = 10;
    }

    if (!set_preferred_target_page_bits(cpu->uc, pagebits)) {
        /* This can only ever happen for hotplugging a CPU, or if
         * the board code incorrectly creates a CPU which it has
         * promised via minimum_page_size that it will not.
         */
        // error_setg(errp, "This CPU requires a smaller page size than the "
        //            "system is using");
        return;
    }
#endif

    /* This cpu-id-to-MPIDR affinity is used only for TCG; KVM will override it.
     * We don't support setting cluster ID ([16..23]) (known as Aff2
     * in later ARM ARM versions), or any of the higher affinity level fields,
     * so these bits always RAZ.
     */
    if (cpu->mp_affinity == ARM64_AFFINITY_INVALID) {
        cpu->mp_affinity = arm_cpu_mp_affinity(cs->cpu_index,
                                               ARM_DEFAULT_CPUS_PER_CLUSTER);
    }

    if (cpu->reset_hivecs) {
            cpu->reset_sctlr |= (1 << 13);
    }

    if (cpu->cfgend) {
        if (arm_feature(&cpu->env, ARM_FEATURE_V7)) {
            cpu->reset_sctlr |= SCTLR_EE;
        } else {
            cpu->reset_sctlr |= SCTLR_B;
        }
    }

    if (!cpu->has_el3) {
        /* If the has_el3 CPU property is disabled then we need to disable the
         * feature.
         */
        unset_feature(env, ARM_FEATURE_EL3);

        /* Disable the security extension feature bits in the processor feature
         * registers as well. These are id_pfr1[7:4] and id_aa64pfr0[15:12].
         */
        cpu->id_pfr1 &= ~0xf0;
        cpu->isar.id_aa64pfr0 &= ~0xf000;
    }

    if (!cpu->has_el2) {
        unset_feature(env, ARM_FEATURE_EL2);
    }

    if (!cpu->has_pmu) {
        unset_feature(env, ARM_FEATURE_PMU);
    }
    if (arm_feature(env, ARM_FEATURE_PMU)) {
        pmu_init(cpu);

        arm_register_pre_el_change_hook(cpu, &pmu_pre_el_change, 0);
        arm_register_el_change_hook(cpu, &pmu_post_el_change, 0);
    } else {
        FIELD_DP64(cpu->isar.id_aa64dfr0, ID_AA64DFR0, PMUVER, 0, cpu->isar.id_aa64dfr0);
        FIELD_DP32(cpu->isar.id_dfr0, ID_DFR0, PERFMON, 0, cpu->isar.id_dfr0);
        cpu->pmceid0 = 0;
        cpu->pmceid1 = 0;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2)) {
        /* Disable the hypervisor feature bits in the processor feature
         * registers if we don't have EL2. These are id_pfr1[15:12] and
         * id_aa64pfr0_el1[11:8].
         */
        cpu->isar.id_aa64pfr0 &= ~0xf00;
        cpu->id_pfr1 &= ~0xf000;
    }

    /* MPU can be configured out of a PMSA CPU either by setting has-mpu
     * to false or by setting pmsav7-dregion to 0.
     */
    if (!cpu->has_mpu) {
        cpu->pmsav7_dregion = 0;
    }
    if (cpu->pmsav7_dregion == 0) {
        cpu->has_mpu = false;
    }

    if (arm_feature(env, ARM_FEATURE_PMSA) &&
        arm_feature(env, ARM_FEATURE_V7)) {
        uint32_t nr = cpu->pmsav7_dregion;

        if (nr > 0xff) {
            // error_setg(errp, "PMSAv7 MPU #regions invalid %" PRIu32, nr);
            return;
        }

        if (nr) {
            if (arm_feature(env, ARM_FEATURE_V8)) {
                /* PMSAv8 */
                env->pmsav8.rbar[M_REG_NS] = g_new0(uint32_t, nr);
                env->pmsav8.rlar[M_REG_NS] = g_new0(uint32_t, nr);
                if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
                    env->pmsav8.rbar[M_REG_S] = g_new0(uint32_t, nr);
                    env->pmsav8.rlar[M_REG_S] = g_new0(uint32_t, nr);
                }
            } else {
                env->pmsav7.drbar = g_new0(uint32_t, nr);
                env->pmsav7.drsr = g_new0(uint32_t, nr);
                env->pmsav7.dracr = g_new0(uint32_t, nr);
            }
        }
    }

    if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        uint32_t nr = cpu->sau_sregion;

        if (nr > 0xff) {
            // error_setg(errp, "v8M SAU #regions invalid %" PRIu32, nr);
            return;
        }

        if (nr) {
            env->sau.rbar = g_new0(uint32_t, nr);
            env->sau.rlar = g_new0(uint32_t, nr);
        }
    }

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        set_feature(env, ARM_FEATURE_VBAR);
    }

    register_cp_regs_for_features(cpu);

    unsigned int smp_cpus = 1;

    if (cpu->has_el3 || arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        cs->num_ases = 2;

        if (!cpu->secure_memory) {
            cpu->secure_memory = cs->memory;
        }
        cpu_address_space_init(cs, ARMASIdx_S, cpu->secure_memory);
    } else {
        cs->num_ases = 1;
    }
    cpu_address_space_init(cs, ARMASIdx_NS, cs->memory);

    /* No core_count specified, default to smp_cpus. */
    if (cpu->core_count == -1) {
        cpu->core_count = smp_cpus;
    }

    cpu_reset(cs);
}